

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessTexturesTests.cpp
# Opt level: O0

IterateResult __thiscall
gl4cts::DirectStateAccess::Textures::GenerateMipmapTest::iterate(GenerateMipmapTest *this)

{
  int iVar1;
  deUint32 dVar2;
  RenderContext *pRVar3;
  undefined4 extraout_var;
  ContextInfo *this_00;
  TestContext *pTVar4;
  TestLog *pTVar5;
  MessageBuilder *pMVar6;
  undefined4 *puVar7;
  Enum<int,_2UL> EVar8;
  MessageBuilder local_508;
  uint local_384;
  undefined1 local_380 [4];
  GLuint k;
  uint local_1fc;
  uint local_1f8;
  GLint mipmap_size;
  GLuint j;
  GLuint i;
  int local_1e8;
  Enum<int,_2UL> local_1e0;
  MessageBuilder local_1d0;
  int local_50;
  GLenum error;
  void *local_40;
  GLubyte *result;
  byte local_2f;
  byte local_2e;
  undefined1 local_2d;
  GLuint texture;
  bool is_error;
  bool is_ok;
  ApiType AStack_28;
  bool is_arb_direct_state_access;
  byte local_21;
  long lStack_20;
  bool is_at_least_gl_45;
  Functions *gl;
  GenerateMipmapTest *this_local;
  
  gl = (Functions *)this;
  pRVar3 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar1 = (*pRVar3->_vptr_RenderContext[3])();
  lStack_20 = CONCAT44(extraout_var,iVar1);
  pRVar3 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  AStack_28.m_bits = (*pRVar3->_vptr_RenderContext[2])();
  texture = (GLuint)glu::ApiType::core(4,5);
  local_21 = glu::contextSupports((ContextType)AStack_28.m_bits,(ApiType)texture);
  this_00 = deqp::Context::getContextInfo((this->super_TestCase).m_context);
  local_2d = glu::ContextInfo::isExtensionSupported(this_00,"GL_ARB_direct_state_access");
  if (((local_21 & 1) != 0) || ((bool)local_2d)) {
    local_2e = 1;
    local_2f = 0;
    result._4_4_ = 0;
    local_40 = (void *)0x0;
    (**(code **)(lStack_20 + 0x6f8))(1,(long)&result + 4);
    dVar2 = (**(code **)(lStack_20 + 0x800))();
    glu::checkError(dVar2,"glGenTextures has failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                    ,0x1a23);
    (**(code **)(lStack_20 + 0xb8))(0xde0,result._4_4_);
    dVar2 = (**(code **)(lStack_20 + 0x800))();
    glu::checkError(dVar2,"glBindTexture has failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                    ,0x1a26);
    (**(code **)(lStack_20 + 0x1308))(0xde0,0,0x8229,0x100,0,0x1903,0x1401,s_texture_data);
    dVar2 = (**(code **)(lStack_20 + 0x800))();
    glu::checkError(dVar2,"glTexImage1D has failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                    ,0x1a29);
    (**(code **)(lStack_20 + 0x720))(result._4_4_);
    local_50 = 0;
    local_50 = (**(code **)(lStack_20 + 0x800))();
    if (local_50 != 0) {
      pTVar4 = deqp::Context::getTestContext((this->super_TestCase).m_context);
      pTVar5 = tcu::TestContext::getLog(pTVar4);
      tcu::TestLog::operator<<(&local_1d0,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar6 = tcu::MessageBuilder::operator<<
                         (&local_1d0,
                          (char (*) [52])"GenerateTextureMipmap unexpectedly generated error ");
      EVar8 = glu::getErrorStr(local_50);
      _j = EVar8.m_getName;
      local_1e8 = EVar8.m_value;
      local_1e0.m_getName = _j;
      local_1e0.m_value = local_1e8;
      pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_1e0);
      pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [14])0x2a850ac);
      tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_1d0);
      local_2e = 0;
    }
    if ((local_2e & 1) != 0) {
      local_40 = operator_new__(0x100);
      if (local_40 == (void *)0x0) {
        puVar7 = (undefined4 *)__cxa_allocate_exception(4);
        *puVar7 = 0;
        __cxa_throw(puVar7,&int::typeinfo,0);
      }
      local_1f8 = 0x100;
      for (mipmap_size = 0; (uint)mipmap_size < 7; mipmap_size = mipmap_size + 1) {
        local_1fc = 0;
        (**(code **)(lStack_20 + 0xab0))(0xde0,mipmap_size,0x1000,&local_1fc);
        dVar2 = (**(code **)(lStack_20 + 0x800))();
        glu::checkError(dVar2,"glGetTexLevelParameteriv has failed",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                        ,0x1a4b);
        if (local_1fc != local_1f8) {
          pTVar4 = deqp::Context::getTestContext((this->super_TestCase).m_context);
          pTVar5 = tcu::TestContext::getLog(pTVar4);
          tcu::TestLog::operator<<
                    ((MessageBuilder *)local_380,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message)
          ;
          pMVar6 = tcu::MessageBuilder::operator<<
                             ((MessageBuilder *)local_380,
                              (char (*) [88])
                              "GenerateTextureMipmap unexpectedly generated mipmap with improper size. Mipmap size is "
                             );
          pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(int *)&local_1fc);
          pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [7])0x2a796ef);
          pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_1f8);
          pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [27])0x2a84efa);
          tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
          tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)local_380);
          local_2e = 0;
          break;
        }
        (**(code **)(lStack_20 + 0xaa0))(0xde0,mipmap_size,0x1903,0x1401,local_40);
        dVar2 = (**(code **)(lStack_20 + 0x800))();
        glu::checkError(dVar2,"glGetTexImage has failed",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                        ,0x1a5b);
        for (local_384 = 0; local_384 < local_1f8 - 1; local_384 = local_384 + 1) {
          if ((int)((uint)*(byte *)((long)local_40 + (ulong)(local_384 + 1)) -
                   (uint)*(byte *)((long)local_40 + (ulong)local_384)) < 0) {
            pTVar4 = deqp::Context::getTestContext((this->super_TestCase).m_context);
            pTVar5 = tcu::TestContext::getLog(pTVar4);
            tcu::TestLog::operator<<(&local_508,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
            pMVar6 = tcu::MessageBuilder::operator<<
                               (&local_508,
                                (char (*) [91])
                                "GenerateTextureMipmap unexpectedly generated improper mipmap (not descending). Test fails."
                               );
            tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
            tcu::MessageBuilder::~MessageBuilder(&local_508);
            local_2e = 0;
            break;
          }
        }
        local_1f8 = local_1f8 >> 1;
      }
    }
    if (result._4_4_ != 0) {
      (**(code **)(lStack_20 + 0x480))(1);
    }
    if ((local_40 != (void *)0x0) && (local_40 != (void *)0x0)) {
      operator_delete__(local_40);
    }
    do {
      iVar1 = (**(code **)(lStack_20 + 0x800))();
    } while (iVar1 != 0);
    if ((local_2e & 1) == 0) {
      if ((local_2f & 1) == 0) {
        tcu::TestContext::setTestResult
                  ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                   QP_TEST_RESULT_FAIL,"Fail");
      }
      else {
        tcu::TestContext::setTestResult
                  ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                   QP_TEST_RESULT_INTERNAL_ERROR,"Error");
      }
    }
    else {
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
                 "Pass");
    }
  }
  else {
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
               QP_TEST_RESULT_NOT_SUPPORTED,"Not Supported");
  }
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult GenerateMipmapTest::iterate()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Get context setup. */
	bool is_at_least_gl_45 = (glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::core(4, 5)));
	bool is_arb_direct_state_access = m_context.getContextInfo().isExtensionSupported("GL_ARB_direct_state_access");

	if ((!is_at_least_gl_45) && (!is_arb_direct_state_access))
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_NOT_SUPPORTED, "Not Supported");

		return STOP;
	}

	/* Running tests. */
	bool is_ok	= true;
	bool is_error = false;

	/* Texture and cpu results storage. */
	glw::GLuint   texture = 0;
	glw::GLubyte* result  = DE_NULL;

	try
	{
		/* Prepare texture. */
		gl.genTextures(1, &texture);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGenTextures has failed");

		gl.bindTexture(GL_TEXTURE_1D, texture);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBindTexture has failed");

		gl.texImage1D(GL_TEXTURE_1D, 0, GL_R8, s_texture_width, 0, GL_RED, GL_UNSIGNED_BYTE, s_texture_data);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glTexImage1D has failed");

		/* Generate mipmaps with tested function. */
		gl.generateTextureMipmap(texture);

		glw::GLenum error = GL_NO_ERROR;

		if (GL_NO_ERROR != (error = gl.getError()))
		{
			m_context.getTestContext().getLog()
				<< tcu::TestLog::Message << "GenerateTextureMipmap unexpectedly generated error "
				<< glu::getErrorStr(error) << ". Test fails." << tcu::TestLog::EndMessage;

			is_ok = false;
		}

		/* Continue only if mipmaps has been generated. */
		if (is_ok)
		{
			result = new glw::GLubyte[s_texture_width];

			if (DE_NULL == result)
			{
				throw 0;
			}

			/* For each mipmap. */
			for (glw::GLuint i = 0, j = s_texture_width;
				 i < s_texture_width_log - 1 /* Do not test single pixel mipmap. */; ++i, j /= 2)
			{
				/* Check mipmap size. */
				glw::GLint mipmap_size = 0;

				gl.getTexLevelParameteriv(GL_TEXTURE_1D, i, GL_TEXTURE_WIDTH, &mipmap_size);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glGetTexLevelParameteriv has failed");

				if (mipmap_size != (glw::GLint)j)
				{
					m_context.getTestContext().getLog()
						<< tcu::TestLog::Message
						<< "GenerateTextureMipmap unexpectedly generated mipmap with improper size. Mipmap size is "
						<< mipmap_size << ", but " << j << " was expected. Test fails." << tcu::TestLog::EndMessage;

					is_ok = false;

					break;
				}

				/* Fetch data. */
				gl.getTexImage(GL_TEXTURE_1D, i, GL_RED, GL_UNSIGNED_BYTE, result);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glGetTexImage has failed");

				/* Make comparison. */
				for (glw::GLuint k = 0; k < j - 1; ++k)
				{
					if (((glw::GLint)result[k + 1]) - ((glw::GLint)result[k]) < 0)
					{
						m_context.getTestContext().getLog() << tcu::TestLog::Message
															<< "GenerateTextureMipmap unexpectedly generated improper "
															   "mipmap (not descending). Test fails."
															<< tcu::TestLog::EndMessage;

						is_ok = false;

						break;
					}
				}
			}
		}
	}
	catch (...)
	{
		is_ok	= false;
		is_error = true;
	}

	/* Cleanup. */
	if (texture)
	{
		gl.deleteTextures(1, &texture);
	}

	if (DE_NULL != result)
	{
		delete[] result;
	}

	while (GL_NO_ERROR != gl.getError())
		;

	/* Result's setup. */
	if (is_ok)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		if (is_error)
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_INTERNAL_ERROR, "Error");
		}
		else
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
		}
	}

	return STOP;
}